

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  uint uVar4;
  ulong uVar5;
  ostream *poVar6;
  string *psVar7;
  cmLocalGenerator *this_00;
  cmake *this_01;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar8;
  byte local_263;
  undefined1 local_248 [16];
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  ostringstream w;
  _Base_ptr local_50;
  string *pWarnCMP0063;
  string warnCMP0063;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  warnCMP0063.field_2._8_8_ = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    return;
  }
  std::__cxx11::string::string((string *)&pWarnCMP0063);
  local_50 = (_Base_ptr)0x0;
  TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local);
  if (((TVar2 != SHARED_LIBRARY) &&
      (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local), TVar2 != MODULE_LIBRARY)
      ) && (bVar1 = cmGeneratorTarget::IsExecutableWithExports((cmGeneratorTarget *)lang_local),
           !bVar1)) {
    PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0063((cmGeneratorTarget *)lang_local);
    if (PVar3 == OLD) goto LAB_004637e7;
    if (PVar3 == WARN) {
      local_50 = (_Base_ptr)&pWarnCMP0063;
    }
  }
  AddVisibilityCompileOption
            ((string *)target_local,(cmGeneratorTarget *)lang_local,this,
             (string *)warnCMP0063.field_2._8_8_,(string *)local_50);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          warnCMP0063.field_2._8_8_,"CXX");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              warnCMP0063.field_2._8_8_,"OBJCXX"), bVar1)) {
    AddInlineVisibilityCompileOption
              ((string *)target_local,(cmGeneratorTarget *)lang_local,this,(string *)local_50,
               (string *)warnCMP0063.field_2._8_8_);
  }
  uVar4 = std::__cxx11::string::empty();
  local_263 = 0;
  if ((uVar4 & 1) == 0) {
    pVar8 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->WarnCMP0063,(value_type *)&lang_local);
    local_263 = pVar8.second;
  }
  if ((local_263 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_218,(cmPolicies *)0x3f,id);
    poVar6 = std::operator<<((ostream *)local_1f8,(string *)&local_218);
    poVar6 = std::operator<<(poVar6,"\nTarget \"");
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)lang_local);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    poVar6 = std::operator<<(poVar6,"\" of type \"");
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)lang_local);
    psVar7 = cmState::GetTargetTypeName_abi_cxx11_(TVar2);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    poVar6 = std::operator<<(poVar6,"\" has the following visibility properties set for ");
    poVar6 = std::operator<<(poVar6,(string *)warnCMP0063.field_2._8_8_);
    poVar6 = std::operator<<(poVar6,":\n");
    poVar6 = std::operator<<(poVar6,(string *)&pWarnCMP0063);
    std::operator<<(poVar6,"For compatibility CMake is not honoring them for this target.");
    std::__cxx11::string::~string((string *)&local_218);
    this_00 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)lang_local);
    this_01 = GetCMakeInstance(this_00);
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_248);
    cmake::IssueMessage(this_01,AUTHOR_WARNING,(string *)(local_248 + 0x10),
                        (cmListFileBacktrace *)local_248);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_248);
    std::__cxx11::string::~string((string *)(local_248 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  }
LAB_004637e7:
  std::__cxx11::string::~string((string *)&pWarnCMP0063);
  return;
}

Assistant:

void cmLocalGenerator::AddVisibilityPresetFlags(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }

  std::string warnCMP0063;
  std::string* pWarnCMP0063 = nullptr;
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY &&
      target->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !target->IsExecutableWithExports()) {
    switch (target->GetPolicyStatusCMP0063()) {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
    }
  }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if (lang == "CXX" || lang == "OBJCXX") {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063, lang);
  }

  if (!warnCMP0063.empty() && this->WarnCMP0063.insert(target).second) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    /* clang-format on */
    target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), target->GetBacktrace());
  }
}